

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampleapp.cpp
# Opt level: O0

void __thiscall SampleApp::SampleApp(SampleApp *this,int *argc,char **argv)

{
  QString local_60;
  QString local_38;
  char **local_20;
  char **argv_local;
  int *argc_local;
  SampleApp *this_local;
  
  local_20 = argv;
  argv_local = (char **)argc;
  argc_local = (int *)this;
  QApplication::QApplication(&this->super_QApplication,argc,argv,0x60204);
  *(undefined ***)this = &PTR_metaObject_00109ce0;
  QString::QString(&local_38,"Sample App");
  QCoreApplication::setApplicationName(&local_38);
  QString::~QString(&local_38);
  QString::QString(&local_60,"0.1");
  QCoreApplication::setApplicationVersion(&local_60);
  QString::~QString(&local_60);
  return;
}

Assistant:

SampleApp::SampleApp(int &argc, char *argv[]) :
    QApplication(argc, argv)
{
    setApplicationName("Sample App");
    setApplicationVersion("0.1");
}